

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory_Banks.c
# Opt level: O1

uint8_t gb_common_reads(MemoryBankController *mc,uint16_t address)

{
  uint uVar1;
  undefined2 in_register_00000032;
  ulong uVar2;
  
  uVar1 = CONCAT22(in_register_00000032,address) - 0xff00;
  uVar2 = (ulong)uVar1;
  if (0x20 < uVar1) {
LAB_0010204d:
    return mc->memory[address];
  }
  if ((0x129000002U >> (uVar2 & 0x3f) & 1) == 0) {
    if (uVar2 != 0) {
      if (uVar2 == 0xf) {
        return mc->memory[address] | 0xe0;
      }
      goto LAB_0010204d;
    }
    if ((mc->memory[0xff00] & 0x20) == 0) {
      return mc->buttons >> 4;
    }
    if ((mc->memory[0xff00] & 0x10) == 0) {
      return mc->buttons;
    }
  }
  return 0xff;
}

Assistant:

uint8_t gb_common_reads(MemoryBankController* mc, uint16_t address) {

    switch (address) {
    case JOYP:
        return gb_read_joypad_input(mc);
    case IF:
        return mc->memory[address] | 0xE0;
    case 0xFF01: case 0xFF18: case 0xFF1B:
    case 0xFF1D: case 0xFF20:
        return 0xFF;
    default:
        return mc->memory[address];
    }
}